

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# result.hpp
# Opt level: O2

void __thiscall
toml::
result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
::cleanup(result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>
          *this,EVP_PKEY_CTX *ctx)

{
  anon_union_200_2_fd5fb55d_for_result<toml::basic_value<toml::type_config>,_std::vector<toml::error_info,_std::allocator<toml::error_info>_>_>_3
  *this_00;
  
  this_00 = &this->field_1;
  if (this->is_ok_ == true) {
    basic_value<toml::type_config>::~basic_value(&(this_00->succ_).value);
    return;
  }
  std::_Destroy_aux<false>::__destroy<toml::error_info*>
            ((this_00->fail_).value.
             super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>._M_impl.
             super__Vector_impl_data._M_start,
             (this->field_1).fail_.value.
             super__Vector_base<toml::error_info,_std::allocator<toml::error_info>_>._M_impl.
             super__Vector_impl_data._M_finish);
  std::_Vector_base<toml::error_info,_std::allocator<toml::error_info>_>::~_Vector_base
            ((_Vector_base<toml::error_info,_std::allocator<toml::error_info>_> *)&this_00->succ_);
  return;
}

Assistant:

void cleanup() noexcept
    {
#if defined(__GNUC__) && ! defined(__clang__)
#pragma GCC diagnostic push
#pragma GCC diagnostic ignored "-Wduplicated-branches"
#endif

        if(this->is_ok_) {this->succ_.~success_type();}
        else             {this->fail_.~failure_type();}

#if defined(__GNUC__) && ! defined(__clang__)
#pragma GCC diagnostic pop
#endif
        return;
    }